

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_90(QPDF *pdf,char *arg2)

{
  allocator<char> local_7a;
  allocator<char> local_79;
  QPDFObjectHandle local_78 [2];
  QPDFObjectHandle local_58 [2];
  string local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  string local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  allocator<char> local_18 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,arg2,(allocator<char> *)local_58);
  QPDF::updateFromJSON((string *)pdf);
  std::__cxx11::string::~string((string *)local_78);
  QPDF::getTrailer();
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::appendItem(local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58[0].super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78[0].super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"/QTest",local_18);
  QPDFObjectHandle::getKey((string *)local_58);
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::appendItem(local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58[0].super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"/QTest",&local_79);
  QPDFObjectHandle::getKey(local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"/strings",&local_7a);
  QPDFObjectHandle::getKey(local_28);
  QPDFObjectHandle::getIntValue();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  std::__cxx11::string::~string((string *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__cxx11::string::~string((string *)local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  QPDF::getRoot();
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::appendItem(local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58[0].super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78[0].super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

static void
test_90(QPDF& pdf, char const* arg2)
{
    // Generate object warning with update-from-json. Crafted to work
    // with good13.pdf and various-updates.json. JSON file is arg2.
    pdf.updateFromJSON(arg2);
    pdf.getTrailer().appendItem(QPDFObjectHandle::newNull());
    pdf.getTrailer().getKey("/QTest").appendItem(QPDFObjectHandle::newNull());
    pdf.getTrailer().getKey("/QTest").getKey("/strings").getIntValue();
    // not from json
    pdf.getRoot().appendItem(QPDFObjectHandle::newNull());
}